

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_delay.c
# Opt level: O1

void * sigdelwrite_new(t_symbol *s,t_floatarg msec)

{
  t_pd *x;
  t_pd p_Var1;
  
  x = pd_new(sigdelwrite_class);
  if (*s->s_name == '\0') {
    s = gensym("delwrite~");
  }
  pd_bind(x,s);
  x[6] = (t_pd)s;
  *(t_floatarg *)(x + 7) = msec;
  *(undefined4 *)(x + 8) = 0;
  p_Var1 = (t_pd)getbytes(0x10);
  x[9] = p_Var1;
  *(undefined4 *)(x + 0xb) = 0;
  x[0xc] = (t_pd)0x0;
  return x;
}

Assistant:

static void *sigdelwrite_new(t_symbol *s, t_floatarg msec)
{
    t_sigdelwrite *x = (t_sigdelwrite *)pd_new(sigdelwrite_class);
    if (!*s->s_name) s = gensym("delwrite~");
    pd_bind(&x->x_obj.ob_pd, s);
    x->x_sym = s;
    x->x_deltime = msec;
    x->x_cspace.c_n = 0;
    x->x_cspace.c_vec = getbytes(XTRASAMPS * sizeof(t_sample));
    x->x_sortno = 0;
    x->x_vecsize = 0;
    x->x_f = 0;
    return (x);
}